

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int equal_wildcard(uchar *pattern,size_t pattern_len,uchar *subject,size_t subject_len,uint flags)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  byte *a;
  byte *pbVar5;
  size_t sVar6;
  byte *pbVar7;
  byte bVar8;
  uchar *puVar9;
  bool bVar10;
  
  if (subject_len < 2) {
    if (pattern_len == 0) {
      pbVar5 = (byte *)0x0;
      goto LAB_003283db;
    }
  }
  else {
    pbVar5 = (byte *)0x0;
    if ((pattern_len == 0) || (*subject == '.')) goto LAB_003283db;
  }
  bVar8 = 1;
  pbVar7 = (byte *)0x0;
  iVar2 = 0;
  sVar6 = pattern_len;
  a = pattern;
  do {
    pbVar5 = (byte *)0x0;
    if (*a == 0x2a) {
      bVar10 = true;
      if (sVar6 != 1) {
        bVar10 = a[1] == 0x2e;
      }
      if ((pbVar7 == (byte *)0x0) && ((bVar8 & 8) == 0 && iVar2 == 0)) {
        if ((bVar10 & bVar8) == 0) {
          pbVar7 = (byte *)0x0;
          goto LAB_0032839c;
        }
        bVar8 = bVar8 & 0xf6;
        bVar10 = true;
        pbVar7 = a;
      }
      else {
LAB_0032839c:
        bVar10 = false;
      }
      if (!bVar10) goto LAB_003283db;
    }
    else {
      iVar1 = OPENSSL_isalnum((uint)*a);
      if (iVar1 == 0) {
        if (*a == 0x2d) {
          pbVar5 = (byte *)0x0;
          if ((bVar8 & 1) != 0) goto LAB_003283db;
          bVar8 = bVar8 | 4;
        }
        else {
          if ((*a != 0x2e) || (pbVar5 = (byte *)0x0, (bVar8 & 5) != 0)) goto LAB_003283db;
          iVar2 = iVar2 + 1;
          bVar8 = 1;
        }
      }
      else {
        if ((3 < sVar6 && (bVar8 & 1) != 0) &&
           (iVar1 = OPENSSL_strncasecmp((char *)a,"xn--",4), iVar1 == 0)) {
          bVar8 = 8;
        }
        bVar8 = bVar8 & 0xfa;
      }
    }
    a = a + 1;
    sVar6 = sVar6 - 1;
  } while (sVar6 != 0);
  if (iVar2 < 2) {
    pbVar7 = (byte *)0x0;
  }
  pbVar5 = pbVar7;
  if ((bVar8 & 5) != 0) {
    pbVar5 = (byte *)0x0;
  }
LAB_003283db:
  if (pbVar5 == (byte *)0x0) {
    iVar2 = equal_nocase(pattern,pattern_len,subject,subject_len,flags);
    return iVar2;
  }
  sVar6 = (long)pbVar5 - (long)pattern;
  puVar9 = pattern + pattern_len + ~(ulong)pbVar5;
  iVar2 = 0;
  if ((puVar9 + sVar6 <= subject_len) &&
     (iVar1 = equal_nocase(pattern,sVar6,subject,sVar6,flags), iVar1 != 0)) {
    sVar3 = subject_len - (long)puVar9;
    iVar1 = equal_nocase(subject + sVar3,(size_t)puVar9,pbVar5 + 1,(size_t)puVar9,flags);
    if (iVar1 != 0) {
      bVar10 = true;
      if (((pbVar5 == pattern) && (pbVar5[1] == 0x2e)) && (bVar10 = false, sVar3 == sVar6)) {
        return 0;
      }
      if ((bVar10 && 3 < subject_len) &&
         (iVar2 = OPENSSL_strncasecmp((char *)subject,"xn--",4), iVar2 == 0)) {
        return 0;
      }
      puVar9 = subject + sVar6;
      if (subject + sVar3 == puVar9 + 1) {
        if (sVar3 == sVar6) {
          return 1;
        }
        if (*puVar9 == '*') {
          return 1;
        }
      }
      else if (sVar3 == sVar6) {
        return 1;
      }
      lVar4 = 0;
      do {
        iVar2 = OPENSSL_isalnum((uint)puVar9[lVar4]);
        if ((iVar2 == 0) && (puVar9[lVar4] != '-')) {
          return 0;
        }
        lVar4 = lVar4 + 1;
      } while ((subject_len - pattern_len) + 1 != lVar4);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int equal_wildcard(const unsigned char *pattern, size_t pattern_len,
                          const unsigned char *subject, size_t subject_len,
                          unsigned int flags) {
  const unsigned char *star = NULL;

  // Subject names starting with '.' can only match a wildcard pattern
  // via a subject sub-domain pattern suffix match.
  if (!(subject_len > 1 && subject[0] == '.')) {
    star = valid_star(pattern, pattern_len, flags);
  }
  if (star == NULL) {
    return equal_nocase(pattern, pattern_len, subject, subject_len, flags);
  }
  return wildcard_match(pattern, star - pattern, star + 1,
                        (pattern + pattern_len) - star - 1, subject,
                        subject_len, flags);
}